

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# position_first_step2.cpp
# Opt level: O3

bool __thiscall
ruckig::PositionFirstOrderStep2::get_profile(PositionFirstOrderStep2 *this,Profile *profile)

{
  bool bVar1;
  double vUp;
  
  vUp = this->pd / this->tf;
  (profile->t)._M_elems[2] = 0.0;
  (profile->t)._M_elems[0] = 0.0;
  (profile->t)._M_elems[1] = 0.0;
  (profile->t)._M_elems[3] = this->tf;
  (profile->t)._M_elems[4] = 0.0;
  (profile->t)._M_elems[5] = 0.0;
  (profile->t)._M_elems[6] = 0.0;
  if ((vUp < this->_vMax + 1e-12) && (this->_vMin + -1e-12 < vUp)) {
    bVar1 = Profile::
            check_for_first_order<(ruckig::Profile::ControlSigns)0,(ruckig::Profile::ReachedLimits)7>
                      (profile,vUp);
    return bVar1;
  }
  return false;
}

Assistant:

bool PositionFirstOrderStep2::get_profile(Profile& profile) {
    const double vf = pd / tf;

    profile.t[0] = 0;
    profile.t[1] = 0;
    profile.t[2] = 0;
    profile.t[3] = tf;
    profile.t[4] = 0;
    profile.t[5] = 0;
    profile.t[6] = 0;

    return profile.check_for_first_order_with_timing<Profile::ControlSigns::UDDU, Profile::ReachedLimits::NONE>(tf, vf, _vMax, _vMin);
}